

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::StartAt(LocationRecorder *this,Token *token)

{
  int iVar1;
  Location *pLVar2;
  LogMessage *pLVar3;
  Location *pLVar4;
  LogFinisher local_61;
  LogMessage local_60;
  
  pLVar2 = this->location_;
  iVar1 = token->line;
  pLVar4 = pLVar2;
  if ((pLVar2->span_).current_size_ < 1) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
               ,0x271);
    pLVar3 = internal::LogMessage::operator<<(&local_60,"CHECK failed: (index) < (size()): ");
    internal::LogFinisher::operator=(&local_61,pLVar3);
    internal::LogMessage::~LogMessage(&local_60);
    pLVar4 = this->location_;
  }
  *(pLVar2->span_).elements_ = iVar1;
  iVar1 = token->column;
  if ((pLVar4->span_).current_size_ < 2) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
               ,0x271);
    pLVar3 = internal::LogMessage::operator<<(&local_60,"CHECK failed: (index) < (size()): ");
    internal::LogFinisher::operator=(&local_61,pLVar3);
    internal::LogMessage::~LogMessage(&local_60);
  }
  (pLVar4->span_).elements_[1] = iVar1;
  return;
}

Assistant:

void Parser::LocationRecorder::StartAt(const io::Tokenizer::Token& token) {
  location_->set_span(0, token.line);
  location_->set_span(1, token.column);
}